

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPersistentModelIndex>::copyAppend
          (QGenericArrayOps<QPersistentModelIndex> *this,QPersistentModelIndex *b,
          QPersistentModelIndex *e)

{
  QPersistentModelIndex *pQVar1;
  QPersistentModelIndex *in_RDX;
  QPersistentModelIndex *in_RSI;
  long in_RDI;
  QPersistentModelIndex *data;
  QPersistentModelIndex *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QPersistentModelIndex>::begin
                       ((QArrayDataPointer<QPersistentModelIndex> *)0x8ef687);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPersistentModelIndex::QPersistentModelIndex(pQVar1 + *(long *)(in_RDI + 0x10),local_10);
      local_10 = local_10 + 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }